

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int64_t icu_63::FixedDecimal::getFractionalDigits(double n,int32_t v)

{
  UBool UVar1;
  double dVar2;
  double dVar3;
  double scaled;
  double fract;
  int32_t v_local;
  double n_local;
  
  if (v != 0) {
    dVar2 = floor(n);
    if ((((n != dVar2) || (NAN(n) || NAN(dVar2))) && (UVar1 = uprv_isNaN_63(n), UVar1 == '\0')) &&
       (UVar1 = uprv_isPositiveInfinity_63(n), UVar1 == '\0')) {
      dVar2 = floor(ABS(n));
      dVar2 = ABS(n) - dVar2;
      if (v == 1) {
        return (long)(dVar2 * 10.0 + 0.5);
      }
      if (v == 2) {
        return (long)(dVar2 * 100.0 + 0.5);
      }
      if (v == 3) {
        return (long)(dVar2 * 1000.0 + 0.5);
      }
      dVar3 = pow(10.0,(double)v);
      dVar2 = floor(dVar2 * dVar3 + 0.5);
      if (9.223372036854776e+18 < dVar2) {
        return 0x7fffffffffffffff;
      }
      return (long)dVar2;
    }
  }
  return 0;
}

Assistant:

int64_t FixedDecimal::getFractionalDigits(double n, int32_t v) {
    if (v == 0 || n == floor(n) || uprv_isNaN(n) || uprv_isPositiveInfinity(n)) {
        return 0;
    }
    n = fabs(n);
    double fract = n - floor(n);
    switch (v) {
      case 1: return (int64_t)(fract*10.0 + 0.5);
      case 2: return (int64_t)(fract*100.0 + 0.5);
      case 3: return (int64_t)(fract*1000.0 + 0.5);
      default:
          double scaled = floor(fract * pow(10.0, (double)v) + 0.5);
          if (scaled > U_INT64_MAX) {
              return U_INT64_MAX;
          } else {
              return (int64_t)scaled;
          }
      }
}